

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Convolution3DLayerParams::SerializeWithCachedSizes
          (Convolution3DLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int32 iVar2;
  Convolution3DLayerParams_PaddingType CVar3;
  int iVar4;
  uint64 value;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Convolution3DLayerParams *this_local;
  
  iVar2 = outputchannels(this);
  if (iVar2 != 0) {
    iVar2 = outputchannels(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(1,iVar2,output);
  }
  iVar2 = inputchannels(this);
  if (iVar2 != 0) {
    iVar2 = inputchannels(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(2,iVar2,output);
  }
  iVar2 = ngroups(this);
  if (iVar2 != 0) {
    iVar2 = ngroups(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(10,iVar2,output);
  }
  iVar2 = kerneldepth(this);
  if (iVar2 != 0) {
    iVar2 = kerneldepth(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x14,iVar2,output);
  }
  iVar2 = kernelheight(this);
  if (iVar2 != 0) {
    iVar2 = kernelheight(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x15,iVar2,output);
  }
  iVar2 = kernelwidth(this);
  if (iVar2 != 0) {
    iVar2 = kernelwidth(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x16,iVar2,output);
  }
  iVar2 = stridedepth(this);
  if (iVar2 != 0) {
    iVar2 = stridedepth(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x1f,iVar2,output);
  }
  iVar2 = strideheight(this);
  if (iVar2 != 0) {
    iVar2 = strideheight(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x20,iVar2,output);
  }
  iVar2 = stridewidth(this);
  if (iVar2 != 0) {
    iVar2 = stridewidth(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x21,iVar2,output);
  }
  iVar2 = dilationdepth(this);
  if (iVar2 != 0) {
    iVar2 = dilationdepth(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x28,iVar2,output);
  }
  iVar2 = dilationheight(this);
  if (iVar2 != 0) {
    iVar2 = dilationheight(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x29,iVar2,output);
  }
  iVar2 = dilationwidth(this);
  if (iVar2 != 0) {
    iVar2 = dilationwidth(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x2a,iVar2,output);
  }
  bVar1 = hasbias(this);
  if (bVar1) {
    bVar1 = hasbias(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x32,bVar1,output);
  }
  bVar1 = has_weights(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x3c,&this->weights_->super_MessageLite,output);
  }
  bVar1 = has_bias(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x3d,&this->bias_->super_MessageLite,output);
  }
  CVar3 = paddingtype(this);
  if (CVar3 != Convolution3DLayerParams_PaddingType_CUSTOM) {
    CVar3 = paddingtype(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(0x46,CVar3,output);
  }
  iVar2 = custompaddingfront(this);
  if (iVar2 != 0) {
    iVar2 = custompaddingfront(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x50,iVar2,output);
  }
  iVar2 = custompaddingback(this);
  if (iVar2 != 0) {
    iVar2 = custompaddingback(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x51,iVar2,output);
  }
  iVar2 = custompaddingtop(this);
  if (iVar2 != 0) {
    iVar2 = custompaddingtop(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x52,iVar2,output);
  }
  iVar2 = custompaddingbottom(this);
  if (iVar2 != 0) {
    iVar2 = custompaddingbottom(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x53,iVar2,output);
  }
  iVar2 = custompaddingleft(this);
  if (iVar2 != 0) {
    iVar2 = custompaddingleft(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x54,iVar2,output);
  }
  iVar2 = custompaddingright(this);
  if (iVar2 != 0) {
    iVar2 = custompaddingright(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x55,iVar2,output);
  }
  bVar1 = isdeconvolution(this);
  if (bVar1) {
    bVar1 = isdeconvolution(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x56,bVar1,output);
  }
  iVar4 = outputshape_size(this);
  if (0 < iVar4) {
    google::protobuf::internal::WireFormatLite::WriteTag(0x57,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_outputshape_cached_byte_size_);
  }
  local_20 = 0;
  iVar4 = outputshape_size(this);
  for (; local_20 < iVar4; local_20 = local_20 + 1) {
    value = outputshape(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(value,output);
  }
  return;
}

Assistant:

void Convolution3DLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Convolution3DLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int32 outputChannels = 1;
  if (this->outputchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->outputchannels(), output);
  }

  // int32 inputChannels = 2;
  if (this->inputchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(2, this->inputchannels(), output);
  }

  // int32 nGroups = 10;
  if (this->ngroups() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(10, this->ngroups(), output);
  }

  // int32 kernelDepth = 20;
  if (this->kerneldepth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(20, this->kerneldepth(), output);
  }

  // int32 kernelHeight = 21;
  if (this->kernelheight() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(21, this->kernelheight(), output);
  }

  // int32 kernelWidth = 22;
  if (this->kernelwidth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(22, this->kernelwidth(), output);
  }

  // int32 strideDepth = 31;
  if (this->stridedepth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(31, this->stridedepth(), output);
  }

  // int32 strideHeight = 32;
  if (this->strideheight() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(32, this->strideheight(), output);
  }

  // int32 strideWidth = 33;
  if (this->stridewidth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(33, this->stridewidth(), output);
  }

  // int32 dilationDepth = 40;
  if (this->dilationdepth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(40, this->dilationdepth(), output);
  }

  // int32 dilationHeight = 41;
  if (this->dilationheight() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(41, this->dilationheight(), output);
  }

  // int32 dilationWidth = 42;
  if (this->dilationwidth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(42, this->dilationwidth(), output);
  }

  // bool hasBias = 50;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(50, this->hasbias(), output);
  }

  // .CoreML.Specification.WeightParams weights = 60;
  if (this->has_weights()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      60, *this->weights_, output);
  }

  // .CoreML.Specification.WeightParams bias = 61;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      61, *this->bias_, output);
  }

  // .CoreML.Specification.Convolution3DLayerParams.PaddingType paddingType = 70;
  if (this->paddingtype() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      70, this->paddingtype(), output);
  }

  // int32 customPaddingFront = 80;
  if (this->custompaddingfront() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(80, this->custompaddingfront(), output);
  }

  // int32 customPaddingBack = 81;
  if (this->custompaddingback() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(81, this->custompaddingback(), output);
  }

  // int32 customPaddingTop = 82;
  if (this->custompaddingtop() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(82, this->custompaddingtop(), output);
  }

  // int32 customPaddingBottom = 83;
  if (this->custompaddingbottom() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(83, this->custompaddingbottom(), output);
  }

  // int32 customPaddingLeft = 84;
  if (this->custompaddingleft() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(84, this->custompaddingleft(), output);
  }

  // int32 customPaddingRight = 85;
  if (this->custompaddingright() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(85, this->custompaddingright(), output);
  }

  // bool isDeconvolution = 86;
  if (this->isdeconvolution() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(86, this->isdeconvolution(), output);
  }

  // repeated uint64 outputShape = 87;
  if (this->outputshape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(87, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_outputshape_cached_byte_size_);
  }
  for (int i = 0, n = this->outputshape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->outputshape(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Convolution3DLayerParams)
}